

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O3

int Fl_Text_Editor::kf_shift_move(int c,Fl_Text_Editor *e)

{
  Fl *this;
  size_t sVar1;
  
  kf_move(c,e);
  fl_text_drag_me((e->super_Fl_Text_Display).mCursorPos,&e->super_Fl_Text_Display);
  this = (Fl *)Fl_Text_Buffer::selection_text((e->super_Fl_Text_Display).mBuffer);
  if (this != (Fl *)0x0) {
    sVar1 = strlen((char *)this);
    Fl::copy(this,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff),(EVP_PKEY_CTX *)0x0);
    free(this);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_shift_move(int c, Fl_Text_Editor* e) {
  kf_move(c, e);
  fl_text_drag_me(e->insert_position(), e);
  char *copy = e->buffer()->selection_text();
  if (copy) {
    Fl::copy(copy, (int) strlen(copy), 0);
    free(copy);
    }
  return 1;
}